

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

sexp_conflict
sexp_signal_mask_set_x_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint *in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  sexp_conflict res;
  int err;
  sexp_conflict local_38;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) &&
     (auVar1._8_8_ = (long)*(ulong *)(in_RSI + 0x38) >> 0x3f,
     auVar1._0_8_ = *(ulong *)(in_RSI + 0x38) & 0xfffffffffffffffe,
     (ulong)*in_RCX == SUB168(auVar1 / SEXT816(2),0))) {
    iVar3 = sigprocmask(2,*(sigset_t **)(in_RCX + 6),(sigset_t *)0x0);
    if (iVar3 == 0) {
      local_38 = (sexp_conflict)0x13e;
    }
    else {
      local_38 = (sexp_conflict)0x3e;
    }
    local_8 = local_38;
  }
  else {
    auVar2._8_8_ = (long)*(ulong *)(in_RSI + 0x38) >> 0x3f;
    auVar2._0_8_ = *(ulong *)(in_RSI + 0x38) & 0xfffffffffffffffe;
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,SUB168(auVar2 / SEXT816(2),0),in_RCX)
    ;
  }
  return local_8;
}

Assistant:

sexp sexp_signal_mask_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1) {
  int err = 0;
  sexp res;
  if (! (sexp_pointerp(arg1) && (sexp_pointer_tag(arg1) == sexp_unbox_fixnum(sexp_opcode_arg2_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), arg1);
  err = sigprocmask(SIG_SETMASK, (sigset_t*)sexp_cpointer_value(arg1), NULL);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}